

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.cpp
# Opt level: O0

int32_t __thiscall
icu_63::Calendar::getWeekendTransition
          (Calendar *this,UCalendarDaysOfWeek dayOfWeek,UErrorCode *status)

{
  UBool UVar1;
  UErrorCode *status_local;
  UCalendarDaysOfWeek dayOfWeek_local;
  Calendar *this_local;
  
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    if (dayOfWeek == this->fWeekendOnset) {
      this_local._4_4_ = this->fWeekendOnsetMillis;
    }
    else if (dayOfWeek == this->fWeekendCease) {
      this_local._4_4_ = this->fWeekendCeaseMillis;
    }
    else {
      *status = U_ILLEGAL_ARGUMENT_ERROR;
      this_local._4_4_ = 0;
    }
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int32_t
Calendar::getWeekendTransition(UCalendarDaysOfWeek dayOfWeek, UErrorCode &status) const
{
    if (U_FAILURE(status)) {
        return 0;
    }
    if (dayOfWeek == fWeekendOnset) {
        return fWeekendOnsetMillis;
    } else if (dayOfWeek == fWeekendCease) {
        return fWeekendCeaseMillis;
    }
    status = U_ILLEGAL_ARGUMENT_ERROR;
    return 0;
}